

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

IPAsKey * __thiscall
BinHash<IPAsKey>::DoInsert(BinHash<IPAsKey> *this,IPAsKey *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t __n;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  IPAsKey **ppIVar5;
  size_t sVar6;
  IPAsKey *pIVar7;
  IPAsKey *pIVar8;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 == 0 || key == (IPAsKey *)0x0) {
LAB_00188f0f:
    key = (IPAsKey *)0x0;
  }
  else {
    uVar3 = key->hash;
    if (uVar3 == 0) {
      key->hash = 0xdeadbeef;
      uVar3 = 0xdeadbeef;
      if (key->addr_len != 0) {
        sVar6 = 0;
        do {
          uVar3 = (uint)key->addr[sVar6] + uVar3 * 0x65;
          key->hash = uVar3;
          sVar6 = sVar6 + 1;
        } while (key->addr_len != sVar6);
      }
    }
    uVar2 = (ulong)uVar3 % (ulong)uVar1;
    ppIVar5 = this->hashBin;
    pIVar7 = ppIVar5[uVar2];
    if (pIVar7 != (IPAsKey *)0x0) {
      __n = key->addr_len;
      pIVar8 = pIVar7;
      do {
        if ((pIVar8->addr_len == __n) && (iVar4 = bcmp(pIVar8->addr,key->addr,__n), iVar4 == 0)) {
          (*pIVar8->_vptr_IPAsKey[3])(pIVar8,key);
          *stored = false;
          return pIVar8;
        }
        pIVar8 = pIVar8->HashNext;
      } while (pIVar8 != (IPAsKey *)0x0);
    }
    if (need_alloc) {
      iVar4 = (*key->_vptr_IPAsKey[2])(key);
      key = (IPAsKey *)CONCAT44(extraout_var,iVar4);
      if (key == (IPAsKey *)0x0) goto LAB_00188f0f;
      ppIVar5 = this->hashBin;
      pIVar7 = ppIVar5[uVar2];
    }
    key->HashNext = pIVar7;
    ppIVar5[uVar2] = key;
    *stored = true;
    this->tableCount = this->tableCount + 1;
  }
  return key;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }